

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_intersect.cpp
# Opt level: O2

bool ON_Intersect(ON_Line *lineA,ON_Line *lineB,double *lineA_parameter,double *lineB_parameter)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ON_3dPoint *this;
  ON_3dPoint *p;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double X [2];
  double pivot;
  ON_Matrix M;
  double Y [2];
  ON_3dPoint pB;
  ON_3dPoint pA;
  ON_3dVector B;
  ON_3dVector C;
  ON_3dVector A;
  ON_3dPoint qB;
  ON_3dPoint qA;
  
  ON_Line::Direction(&A,lineA);
  ON_Line::Direction(&B,lineB);
  this = ON_Line::operator[](lineB,0);
  p = ON_Line::operator[](lineA,0);
  ON_3dPoint::operator-(&C,this,p);
  ON_Matrix::ON_Matrix(&M,2,2);
  dVar5 = ON_DotProduct(&A,&A);
  pdVar4 = ON_Matrix::operator[](&M,0);
  *pdVar4 = dVar5;
  dVar5 = ON_DotProduct(&B,&B);
  pdVar4 = ON_Matrix::operator[](&M,1);
  pdVar4[1] = dVar5;
  dVar5 = ON_DotProduct(&A,&B);
  pdVar4 = ON_Matrix::operator[](&M,1);
  *pdVar4 = -dVar5;
  pdVar4 = ON_Matrix::operator[](&M,0);
  pdVar4[1] = -dVar5;
  pdVar4 = ON_Matrix::operator[](&M,0);
  dVar5 = *pdVar4;
  pdVar4 = ON_Matrix::operator[](&M,1);
  bVar1 = dVar5 < pdVar4[1];
  if (bVar1) {
    ON_Matrix::SwapCols(&M,0,1);
  }
  pdVar4 = ON_Matrix::operator[](&M,1);
  if (ABS(pdVar4[1]) <= 1.0) {
    dVar5 = 2.220446049250313e-16;
    dVar7 = 1.490116119385e-08;
  }
  else {
    pdVar4 = ON_Matrix::operator[](&M,1);
    dVar7 = pdVar4[1];
    pdVar4 = ON_Matrix::operator[](&M,1);
    dVar5 = ABS(pdVar4[1]) * 2.220446049250313e-16;
    dVar7 = ABS(dVar7) * 1.490116119385e-08;
  }
  Y[0] = ON_DotProduct(&A,&C);
  dVar6 = ON_DotProduct(&B,&C);
  Y[1] = -dVar6;
  iVar3 = ON_Matrix::RowReduce(&M,dVar5,Y,&pivot);
  if (iVar3 != 2) {
LAB_004d40b4:
    bVar2 = false;
    goto LAB_004d40b6;
  }
  bVar2 = ON_3dPoint::operator==(&lineA->from,&lineB->from);
  if (bVar2) {
    if (lineA_parameter != (double *)0x0) {
      *lineA_parameter = 0.0;
    }
LAB_004d3e8d:
    bVar2 = true;
    if (lineB_parameter != (double *)0x0) {
      *lineB_parameter = 0.0;
    }
  }
  else {
    bVar2 = ON_3dPoint::operator==(&lineA->from,&lineB->to);
    if (bVar2) {
      if (lineA_parameter != (double *)0x0) {
        *lineA_parameter = 0.0;
      }
    }
    else {
      bVar2 = ON_3dPoint::operator==(&lineA->to,&lineB->from);
      if (bVar2) {
        if (lineA_parameter != (double *)0x0) {
          *lineA_parameter = 1.0;
        }
        goto LAB_004d3e8d;
      }
      bVar2 = ON_3dPoint::operator==(&lineA->to,&lineB->to);
      if (!bVar2) {
        bVar2 = ON_Matrix::BackSolve(&M,0.0,2,Y,X);
        if (bVar2) {
          if (lineA_parameter != (double *)0x0) {
            *lineA_parameter = X[bVar1];
          }
          if (lineB_parameter != (double *)0x0) {
            *lineB_parameter = X[bVar1 ^ 1];
          }
          bVar2 = true;
          if (dVar7 < ABS(pivot)) goto LAB_004d40b6;
          ON_Line::PointAt(&pA,lineA,X[bVar1]);
          ON_Line::PointAt(&pB,lineB,X[bVar1 ^ 1]);
          dVar5 = ON_3dPoint::DistanceTo(&pA,&pB);
          bVar2 = true;
          if ((dVar5 <= dVar7) || (dVar5 <= 2.3283064365386963e-10)) goto LAB_004d40b6;
          ON_Line::ClosestPointTo(&qA,lineA,&pB);
          ON_Line::ClosestPointTo(&qB,lineB,&pA);
          dVar7 = ON_3dPoint::DistanceTo(&pA,&qB);
          dVar6 = ON_3dPoint::DistanceTo(&pB,&qA);
          if ((dVar5 <= dVar7 * 1.1) && (bVar2 = true, dVar5 <= dVar6 * 1.1)) goto LAB_004d40b6;
        }
        goto LAB_004d40b4;
      }
      if (lineA_parameter != (double *)0x0) {
        *lineA_parameter = 1.0;
      }
    }
    bVar2 = true;
    if (lineB_parameter != (double *)0x0) {
      bVar2 = true;
      *lineB_parameter = 1.0;
    }
  }
LAB_004d40b6:
  ON_Matrix::~ON_Matrix(&M);
  return bVar2;
}

Assistant:

bool ON_Intersect( const ON_Line& lineA, const ON_Line& lineB, 
                double* lineA_parameter, 
                double* lineB_parameter
                )
{
  // If you are looking at this code because you don't like an
  // answer you are getting, then the first thing to try is
  // to read the header file comments and try calling 
  // ON_IntersectLineLine.
  bool rc = false;
  double M_zero_tol = 0.0;
  int i, rank;
  double pr_tolerance, pivot, X[2], Y[2];

  ON_3dVector A = lineA.Direction();
  ON_3dVector B = lineB.Direction();
  ON_3dVector C = lineB[0] - lineA[0];
  
  ON_Matrix M(2,2);
  M[0][0] =  ON_DotProduct( A, A );
  M[1][1] =  ON_DotProduct( B, B );
  M[0][1] = M[1][0] = -ON_DotProduct( A, B );

  // this swap done to get row+col pivot accuracy
  if ( M[0][0] < M[1][1] ) {
    M.SwapCols(0,1);
    i = 1;
  }
  else {
    i = 0;
  }
  // 2021-07-21, Pierre, RH-65014
  // It does not make much sense to use a tolerance lower than ON_EPSILON on the
  // result of arithmetic on doubles. If M[1][1] is smaller than 1, we need to
  // bound M_zero_tol to ON_EPSILON or ON_Intersect will wrongly return true on
  // many near-parallel cases. pr_tolerance also needs to be bounded as it
  // cannot be smaller than M_zero_tolerance.
  //
  // Before that change, lines
  // Line A = (5.4301839655138417, -9.5, 0, -0.6, -9.5, 0)
  // Line B = (5.2373595635311068, 10.5, 0, 5.6603292194932395, 10.5, 0)
  // would be found as intersecting, with pivot ~= 2 * M_zero_tolerance
  if (fabs(M[1][1]) > 1.) {
    pr_tolerance = fabs(M[1][1]) * ON_SQRT_EPSILON;
    M_zero_tol = fabs(M[1][1]) * ON_EPSILON;
  } else {
    pr_tolerance = ON_SQRT_EPSILON;
    M_zero_tol = ON_EPSILON;
  }

  Y[0] =  ON_DotProduct( A, C );
  Y[1] = -ON_DotProduct( B, C );

  rank = M.RowReduce( M_zero_tol, Y, &pivot );
  if ( rank == 2 ) 
  {
    // 19 November 2003 Dale Lear and Chuck
    //   Added lineA.from/to == lineB.from/to tests
    //   so exact answer gets returned when people
    //   expect it.
    rc = true;
    if ( lineA.from == lineB.from )
    {
      if ( lineA_parameter )
        *lineA_parameter = 0.0;
      if ( lineB_parameter )
        *lineB_parameter = 0.0;
    }
    else if ( lineA.from == lineB.to )
    {
      if ( lineA_parameter )
        *lineA_parameter = 0.0;
      if ( lineB_parameter )
        *lineB_parameter = 1.0;
    }
    else if ( lineA.to == lineB.from )
    {
      if ( lineA_parameter )
        *lineA_parameter = 1.0;
      if ( lineB_parameter )
        *lineB_parameter = 0.0;
    }
    else if ( lineA.to == lineB.to )
    {
      if ( lineA_parameter )
        *lineA_parameter = 1.0;
      if ( lineB_parameter )
        *lineB_parameter = 1.0;
    }
    else
    {
      rc = M.BackSolve( 0.0, 2, Y, X );
      if ( rc ) 
      {
        if ( lineA_parameter )
          *lineA_parameter = X[i];
        if ( lineB_parameter )
          *lineB_parameter = X[1-i];
        if ( fabs(pivot) <= pr_tolerance ) 
        {
          // test answer because matrix was close to singular
          // (This test is slow but it is rarely used.)
          ON_3dPoint pA = lineA.PointAt(X[i]);
          ON_3dPoint pB = lineB.PointAt(X[1-i]);
          double d = pA.DistanceTo(pB);
          if ( d > pr_tolerance && d > ON_ZERO_TOLERANCE ) { 
            ON_3dPoint qA = lineA.ClosestPointTo(pB);
            ON_3dPoint qB = lineB.ClosestPointTo(pA);
            double dA = pA.DistanceTo(qB);
            double dB = pB.DistanceTo(qA);
            if ( 1.1*dA < d ) {
              rc = false;
            }
            else if ( 1.1*dB < d ) {
              rc = false;
            }
          }
        }
      }
    }
  }
  
  return rc;
}